

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O3

void __thiscall
TestOutput::printVisualStudioErrorInFileOnLine
          (TestOutput *this,SimpleString *file,size_t lineNumber)

{
  char *pcVar1;
  
  (*this->_vptr_TestOutput[0xb])(this,"\n");
  pcVar1 = SimpleString::asCharString(file);
  (*this->_vptr_TestOutput[0xb])(this,pcVar1);
  (*this->_vptr_TestOutput[0xb])(this,"(");
  (*this->_vptr_TestOutput[0xd])(this,lineNumber);
  (*this->_vptr_TestOutput[0xb])(this,"):");
  (*this->_vptr_TestOutput[0xb])(this," error:");
  return;
}

Assistant:

void TestOutput::printVisualStudioErrorInFileOnLine(SimpleString file, size_t lineNumber)
{
    print("\n");
    print(file.asCharString());
    print("(");
    print(lineNumber);
    print("):");
    print(" error:");
}